

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

Vec2 __thiscall
tcu::computeCubeLodBoundsFromDerivates
          (tcu *this,Vec3 *coord,Vec3 *coordDx,Vec3 *coordDy,int faceSize,LodPrecision *prec)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  CubeFace CVar7;
  float *pfVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Vec2 extraout_XMM0_Qa;
  Vector<float,_2> local_88;
  Vec2 bounds;
  float dvdy;
  float dudy;
  float dvdx;
  float dudx;
  float mady;
  float tcdy;
  float scdy;
  float madx;
  float tcdx;
  float scdx;
  float ma;
  float tc;
  float sc;
  int tNdx;
  int sNdx;
  int maNdx;
  CubeFace face;
  bool allowBrokenEdgeDerivate;
  LodPrecision *prec_local;
  int faceSize_local;
  Vec3 *coordDy_local;
  Vec3 *coordDx_local;
  Vec3 *coord_local;
  
  CVar7 = selectCubeFace(coord);
  tNdx = 0;
  sc = 0.0;
  tc = 0.0;
  if (CVar7 < CUBEFACE_NEGATIVE_Y) {
    tNdx = 0;
    sc = 2.8026e-45;
    tc = 1.4013e-45;
  }
  else if (CVar7 - CUBEFACE_NEGATIVE_Y < 2) {
    tNdx = 1;
    sc = 0.0;
    tc = 2.8026e-45;
  }
  else if (CVar7 - CUBEFACE_NEGATIVE_Z < 2) {
    tNdx = 2;
    sc = 0.0;
    tc = 1.4013e-45;
  }
  pfVar8 = Vector<float,_3>::operator[](coord,(int)sc);
  fVar1 = *pfVar8;
  pfVar8 = Vector<float,_3>::operator[](coord,(int)tc);
  fVar2 = *pfVar8;
  pfVar8 = Vector<float,_3>::operator[](coord,tNdx);
  fVar9 = de::abs<float>(*pfVar8);
  pfVar8 = Vector<float,_3>::operator[](coordDx,(int)sc);
  fVar3 = *pfVar8;
  pfVar8 = Vector<float,_3>::operator[](coordDx,(int)tc);
  fVar4 = *pfVar8;
  pfVar8 = Vector<float,_3>::operator[](coordDx,tNdx);
  fVar10 = de::abs<float>(*pfVar8);
  pfVar8 = Vector<float,_3>::operator[](coordDy,(int)sc);
  fVar5 = *pfVar8;
  pfVar8 = Vector<float,_3>::operator[](coordDy,(int)tc);
  fVar6 = *pfVar8;
  pfVar8 = Vector<float,_3>::operator[](coordDy,tNdx);
  fVar11 = de::abs<float>(*pfVar8);
  bounds.m_data[1] = ((float)faceSize * 0.5 * (fVar5 * fVar9 + -(fVar1 * fVar11))) / (fVar9 * fVar9)
  ;
  bounds.m_data[0] = ((float)faceSize * 0.5 * (fVar6 * fVar9 + -(fVar2 * fVar11))) / (fVar9 * fVar9)
  ;
  computeLodBoundsFromDerivates
            ((tcu *)&local_88,
             ((float)faceSize * 0.5 * (fVar3 * fVar9 + -(fVar1 * fVar10))) / (fVar9 * fVar9),
             ((float)faceSize * 0.5 * (fVar4 * fVar9 + -(fVar2 * fVar10))) / (fVar9 * fVar9),
             bounds.m_data[1],bounds.m_data[0],prec);
  Vector<float,_2>::Vector((Vector<float,_2> *)this,&local_88);
  return (Vec2)extraout_XMM0_Qa.m_data;
}

Assistant:

Vec2 computeCubeLodBoundsFromDerivates (const Vec3& coord, const Vec3& coordDx, const Vec3& coordDy, const int faceSize, const LodPrecision& prec)
{
	const bool			allowBrokenEdgeDerivate		= false;
	const CubeFace		face						= selectCubeFace(coord);
	int					maNdx						= 0;
	int					sNdx						= 0;
	int					tNdx						= 0;

	// \note Derivate signs don't matter when computing lod
	switch (face)
	{
		case CUBEFACE_NEGATIVE_X:
		case CUBEFACE_POSITIVE_X: maNdx = 0; sNdx = 2; tNdx = 1; break;
		case CUBEFACE_NEGATIVE_Y:
		case CUBEFACE_POSITIVE_Y: maNdx = 1; sNdx = 0; tNdx = 2; break;
		case CUBEFACE_NEGATIVE_Z:
		case CUBEFACE_POSITIVE_Z: maNdx = 2; sNdx = 0; tNdx = 1; break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	{
		const float		sc		= coord[sNdx];
		const float		tc		= coord[tNdx];
		const float		ma		= de::abs(coord[maNdx]);
		const float		scdx	= coordDx[sNdx];
		const float		tcdx	= coordDx[tNdx];
		const float		madx	= de::abs(coordDx[maNdx]);
		const float		scdy	= coordDy[sNdx];
		const float		tcdy	= coordDy[tNdx];
		const float		mady	= de::abs(coordDy[maNdx]);
		const float		dudx	= float(faceSize) * 0.5f * (scdx*ma - sc*madx) / (ma*ma);
		const float		dvdx	= float(faceSize) * 0.5f * (tcdx*ma - tc*madx) / (ma*ma);
		const float		dudy	= float(faceSize) * 0.5f * (scdy*ma - sc*mady) / (ma*ma);
		const float		dvdy	= float(faceSize) * 0.5f * (tcdy*ma - tc*mady) / (ma*ma);
		const Vec2		bounds	= computeLodBoundsFromDerivates(dudx, dvdx, dudy, dvdy, prec);

		// Implementations may compute derivate from projected (s, t) resulting in incorrect values at edges.
		if (allowBrokenEdgeDerivate)
		{
			const Vec3			dxErr		= computeFloatingPointError(coordDx, IVec3(prec.derivateBits));
			const Vec3			dyErr		= computeFloatingPointError(coordDy, IVec3(prec.derivateBits));
			const Vec3			xoffs		= abs(coordDx) + dxErr;
			const Vec3			yoffs		= abs(coordDy) + dyErr;

			if (selectCubeFace(coord + xoffs) != face ||
				selectCubeFace(coord - xoffs) != face ||
				selectCubeFace(coord + yoffs) != face ||
				selectCubeFace(coord - yoffs) != face)
			{
				return Vec2(bounds.x(), 1000.0f);
			}
		}

		return bounds;
	}
}